

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysc_must_free(lysf_ctx *ctx,lysc_must *must)

{
  lysc_ext_instance *plVar1;
  long lVar2;
  void *pvVar3;
  
  if (must != (lysc_must *)0x0) {
    lyxp_expr_free(ctx->ctx,must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED,must->prefixes);
    lydict_remove(ctx->ctx,must->emsg);
    lydict_remove(ctx->ctx,must->eapptag);
    lydict_remove(ctx->ctx,must->dsc);
    lydict_remove(ctx->ctx,must->ref);
    plVar1 = must->exts;
    if (plVar1 != (lysc_ext_instance *)0x0) {
      pvVar3 = (void *)0xffffffffffffffff;
      lVar2 = 0;
      do {
        pvVar3 = (void *)((long)pvVar3 + 1);
        if (plVar1[-1].compiled <= pvVar3) {
          free(&plVar1[-1].compiled);
          return;
        }
        plVar1 = (lysc_ext_instance *)((long)&plVar1->def + lVar2);
        lVar2 = lVar2 + 0x48;
        lysc_ext_instance_free(ctx,plVar1);
        plVar1 = must->exts;
      } while (plVar1 != (lysc_ext_instance *)0x0);
    }
  }
  return;
}

Assistant:

static void
lysc_must_free(struct lysf_ctx *ctx, struct lysc_must *must)
{
    if (!must) {
        return;
    }

    lyxp_expr_free(ctx->ctx, must->cond);
    ly_free_prefix_data(LY_VALUE_SCHEMA_RESOLVED, must->prefixes);
    lydict_remove(ctx->ctx, must->emsg);
    lydict_remove(ctx->ctx, must->eapptag);
    lydict_remove(ctx->ctx, must->dsc);
    lydict_remove(ctx->ctx, must->ref);
    FREE_ARRAY(ctx, must->exts, lysc_ext_instance_free);
}